

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O2

void Gia_ManQuantSetSuppCi(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Vec_Wrd_t *__ptr;
  uint __line;
  Vec_Wrd_t *p_00;
  word *pwVar1;
  int iVar2;
  int nCap;
  char *__assertion;
  long lVar3;
  
  if ((~*(uint *)pObj & 0x9fffffff) == 0) {
    if (p->vSuppWords != (Vec_Wrd_t *)0x0) {
      iVar2 = p->iSuppPi;
      if (iVar2 == p->nSuppWords << 6) {
        iVar2 = p->vSuppWords->nSize;
        nCap = 1000;
        if (iVar2 != 0) {
          nCap = iVar2 * 2;
        }
        p_00 = Vec_WrdAlloc(nCap);
        lVar3 = 0;
        iVar2 = 0;
        while( true ) {
          __ptr = p->vSuppWords;
          if (__ptr->nSize <= lVar3) break;
          Vec_WrdPush(p_00,__ptr->pArray[lVar3]);
          iVar2 = iVar2 + 1;
          if (iVar2 == p->nSuppWords) {
            iVar2 = 0;
            Vec_WrdPush(p_00,0);
          }
          lVar3 = lVar3 + 1;
        }
        free(__ptr->pArray);
        free(__ptr);
        p->vSuppWords = p_00;
        iVar2 = p->nSuppWords + 1;
        p->nSuppWords = iVar2;
        if (p_00->nSize != iVar2 * p->nObjs) {
          __assert_fail("Vec_WrdSize(p->vSuppWords) == p->nSuppWords * Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaExist.c"
                        ,0x89,"void Gia_ManQuantSetSuppCi(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar2 = p->iSuppPi;
      }
      if (iVar2 == (p->vSuppVars).nSize) {
        iVar2 = Gia_ObjCioId(pObj);
        Vec_IntPush(&p->vSuppVars,iVar2);
        pwVar1 = Gia_ManQuantInfo(p,pObj);
        iVar2 = p->iSuppPi;
        p->iSuppPi = iVar2 + 1;
        pwVar1[iVar2 >> 6] = pwVar1[iVar2 >> 6] | 1L << ((byte)iVar2 & 0x3f);
        return;
      }
      __assert_fail("p->iSuppPi == Vec_IntSize(&p->vSuppVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaExist.c"
                    ,0x8c,"void Gia_ManQuantSetSuppCi(Gia_Man_t *, Gia_Obj_t *)");
    }
    __assertion = "p->vSuppWords != NULL";
    __line = 0x78;
  }
  else {
    __assertion = "Gia_ObjIsCi(pObj)";
    __line = 0x77;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaExist.c"
                ,__line,"void Gia_ManQuantSetSuppCi(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManQuantSetSuppCi( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    assert( Gia_ObjIsCi(pObj) );
    assert( p->vSuppWords != NULL );
    if ( p->iSuppPi == 64 * p->nSuppWords )
    {
        word Data; int w, Count = 0, Size = Vec_WrdSize(p->vSuppWords);
        Vec_Wrd_t * vTemp = Vec_WrdAlloc( Size ? 2 * Size : 1000 ); 
        Vec_WrdForEachEntry( p->vSuppWords, Data, w )
        {
            Vec_WrdPush( vTemp, Data );
            if ( ++Count == p->nSuppWords )
            {
                Vec_WrdPush( vTemp, 0 );
                Count = 0;
            }
        }
        Vec_WrdFree( p->vSuppWords );
        p->vSuppWords = vTemp;
        p->nSuppWords++;
        assert( Vec_WrdSize(p->vSuppWords) == p->nSuppWords * Gia_ManObjNum(p) );
        //printf( "Resizing to %d words.\n", p->nSuppWords );
    }
    assert( p->iSuppPi == Vec_IntSize(&p->vSuppVars) );
    Vec_IntPush( &p->vSuppVars, Gia_ObjCioId(pObj) );
    Abc_TtSetBit( Gia_ManQuantInfo(p, pObj), p->iSuppPi++ );
}